

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.h
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
rlib::midi::inner::getVariableValue(uint64_t n)

{
  bool bVar1;
  ulong in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  VariableValue vv;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  VariableByte local_33;
  VariableByte local_32;
  VariableByte local_31;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffd0;
  VariableByte local_1a;
  ulong local_19;
  undefined1 local_11;
  ulong local_10;
  
  local_11 = 0;
  this = in_RDI;
  local_10 = in_RSI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1cf504);
  VariableValue::VariableValue((VariableValue *)&local_19);
  local_19 = local_10;
  if ((local_10 >> 0x31 & 0x7f) != 0) {
    VariableByte::VariableByte(&local_1a,(byte)(uint)(local_10 >> 0x31) & 0x7f,true);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (this,(value_type_conflict *)in_RDI);
  }
  if (((local_19 >> 0x2a & 0x7f) != 0) ||
     (bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        (in_stack_ffffffffffffffd0), !bVar1)) {
    VariableByte::VariableByte
              ((VariableByte *)&stack0xffffffffffffffd3,(byte)(uint)(local_19 >> 0x2a) & 0x7f,true);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (this,(value_type_conflict *)in_RDI);
  }
  if (((local_19 >> 0x23 & 0x7f) != 0) ||
     (bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        (in_stack_ffffffffffffffd0), !bVar1)) {
    VariableByte::VariableByte
              ((VariableByte *)&stack0xffffffffffffffd2,(byte)(uint)(local_19 >> 0x23) & 0x7f,true);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (this,(value_type_conflict *)in_RDI);
  }
  if (((local_19 >> 0x1c & 0x7f) != 0) ||
     (bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        (in_stack_ffffffffffffffd0), !bVar1)) {
    VariableByte::VariableByte
              ((VariableByte *)&stack0xffffffffffffffd1,(byte)(local_19 >> 0x1c) & 0x7f,true);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (this,(value_type_conflict *)in_RDI);
  }
  if (((local_19 >> 0x15 & 0x7f) != 0) ||
     (bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        (in_stack_ffffffffffffffd0), !bVar1)) {
    VariableByte::VariableByte
              ((VariableByte *)&stack0xffffffffffffffd0,(byte)((uint)local_19 >> 0x15) & 0x7f,true);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (this,(value_type_conflict *)in_RDI);
  }
  if (((local_19 >> 0xe & 0x7f) != 0) ||
     (bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        (in_stack_ffffffffffffffd0), !bVar1)) {
    VariableByte::VariableByte(&local_31,(byte)((uint)local_19 >> 0xe) & 0x7f,true);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (this,(value_type_conflict *)in_RDI);
  }
  if (((local_19 >> 7 & 0x7f) != 0) ||
     (bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        (in_stack_ffffffffffffffd0), !bVar1)) {
    VariableByte::VariableByte(&local_32,(byte)((uint)local_19 >> 7) & 0x7f,true);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (this,(value_type_conflict *)in_RDI);
  }
  VariableByte::VariableByte(&local_33,(byte)local_19 & 0x7f,false);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (this,(value_type_conflict *)in_RDI);
  return this;
}

Assistant:

static std::vector<uint8_t> getVariableValue(uint64_t n) {
			std::vector<uint8_t> v;
			VariableValue vv;
			vv.value = n;
			if (vv.b7) v.push_back(VariableByte(vv.b7, true).value);
			if (vv.b6 || !v.empty()) v.push_back(VariableByte(vv.b6, true).value);
			if (vv.b5 || !v.empty()) v.push_back(VariableByte(vv.b5, true).value);
			if (vv.b4 || !v.empty()) v.push_back(VariableByte(vv.b4, true).value);
			if (vv.b3 || !v.empty()) v.push_back(VariableByte(vv.b3, true).value);
			if (vv.b2 || !v.empty()) v.push_back(VariableByte(vv.b2, true).value);
			if (vv.b1 || !v.empty()) v.push_back(VariableByte(vv.b1, true).value);
			v.push_back(VariableByte(vv.b0, false).value);
			return v;
		}